

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TabItemBackground(ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImU32 col)

{
  ImVector<ImVec2> *this;
  ImGuiContext *pIVar1;
  ImU32 col_00;
  float fVar2;
  float fVar3;
  ImVec2 local_68;
  float local_60;
  ImU32 local_5c;
  undefined1 local_58 [12];
  float fStack_4c;
  undefined1 local_48 [16];
  
  pIVar1 = GImGui;
  local_68.x = (bb->Min).x;
  fVar2 = (bb->Max).x - local_68.x;
  local_5c = col;
  if (0.0 < fVar2) {
    fVar3 = (GImGui->Style).TabRounding;
    fVar2 = fVar2 * 0.5 + -1.0;
    if (fVar2 <= fVar3) {
      fVar3 = fVar2;
    }
    local_48 = ZEXT416(~-(uint)(fVar3 <= 0.0) & (uint)fVar3);
    _local_58 = ZEXT416((uint)((bb->Min).y + 1.0));
    local_60 = (bb->Max).y + -1.0;
    local_68.y = local_60;
    this = &draw_list->_Path;
    ImVector<ImVec2>::push_back(this,&local_68);
    local_58._0_4_ = (float)local_58._0_4_ + (float)local_48._0_4_;
    local_68.y = (float)local_58._0_4_;
    local_68.x = (bb->Min).x + (float)local_48._0_4_;
    ImDrawList::PathArcToFast(draw_list,&local_68,(float)local_48._0_4_,6,9);
    local_68.y = (float)local_58._0_4_;
    local_68.x = (bb->Max).x - (float)local_48._0_4_;
    ImDrawList::PathArcToFast(draw_list,&local_68,(float)local_48._0_4_,9,0xc);
    local_68.y = local_60;
    local_68.x = (bb->Max).x;
    ImVector<ImVec2>::push_back(this,&local_68);
    ImDrawList::PathFillConvex(draw_list,local_5c);
    if (0.0 < (pIVar1->Style).TabBorderSize) {
      local_68.y = local_60;
      local_68.x = (bb->Min).x + 0.5;
      ImVector<ImVec2>::push_back(this,&local_68);
      fVar2 = (bb->Min).x + (float)local_48._0_4_ + 0.5;
      fVar3 = (float)local_58._0_4_ + 0.5;
      fStack_4c = (float)local_58._4_4_ + 0.0;
      local_58._4_4_ = fVar3;
      local_58._0_4_ = fVar2;
      local_58._8_4_ = 0;
      local_68.y = fVar3;
      local_68.x = fVar2;
      ImDrawList::PathArcToFast(draw_list,&local_68,(float)local_48._0_4_,6,9);
      local_68.y = (float)local_58._4_4_;
      local_68.x = ((bb->Max).x - (float)local_48._0_4_) + -0.5;
      ImDrawList::PathArcToFast(draw_list,&local_68,(float)local_48._0_4_,9,0xc);
      local_68.y = local_60;
      local_68.x = (bb->Max).x + -0.5;
      ImVector<ImVec2>::push_back(this,&local_68);
      col_00 = GetColorU32(5,1.0);
      ImDrawList::PathStroke(draw_list,col_00,false,(pIVar1->Style).TabBorderSize);
    }
    return;
  }
  __assert_fail("width > 0.0f",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                ,0x1c8e,
                "void ImGui::TabItemBackground(ImDrawList *, const ImRect &, ImGuiTabItemFlags, ImU32)"
               );
}

Assistant:

void ImGui::TabItemBackground(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImU32 col)
{
    // While rendering tabs, we trim 1 pixel off the top of our bounding box so they can fit within a regular frame height while looking "detached" from it.
    ImGuiContext& g = *GImGui;
    const float width = bb.GetWidth();
    IM_UNUSED(flags);
    IM_ASSERT(width > 0.0f);
    const float rounding = ImMax(0.0f, ImMin(g.Style.TabRounding, width * 0.5f - 1.0f));
    const float y1 = bb.Min.y + 1.0f;
    const float y2 = bb.Max.y - 1.0f;
    draw_list->PathLineTo(ImVec2(bb.Min.x, y2));
    draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding, y1 + rounding), rounding, 6, 9);
    draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding, y1 + rounding), rounding, 9, 12);
    draw_list->PathLineTo(ImVec2(bb.Max.x, y2));
    draw_list->PathFillConvex(col);
    if (g.Style.TabBorderSize > 0.0f)
    {
        draw_list->PathLineTo(ImVec2(bb.Min.x + 0.5f, y2));
        draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding + 0.5f, y1 + rounding + 0.5f), rounding, 6, 9);
        draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding - 0.5f, y1 + rounding + 0.5f), rounding, 9, 12);
        draw_list->PathLineTo(ImVec2(bb.Max.x - 0.5f, y2));
        draw_list->PathStroke(GetColorU32(ImGuiCol_Border), false, g.Style.TabBorderSize);
    }
}